

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrNSImpl.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DOMAttrNSImpl::setPrefix(DOMAttrNSImpl *this,XMLCh *prefix)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  DOMDocument *pDVar4;
  bool bVar5;
  int iVar6;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  undefined4 extraout_var;
  ulong uVar11;
  DOMStringPoolEntry *pDVar12;
  undefined4 extraout_var_01;
  ulong uVar13;
  long lVar14;
  undefined4 extraout_var_02;
  DOMException *this_00;
  undefined4 extraout_var_03;
  undefined8 *puVar15;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  DOMStringPoolEntry *pDVar16;
  XMLCh XVar17;
  XMLSize_t XVar18;
  long lVar19;
  DOMDocumentImpl *this_01;
  XMLCh temp [256];
  XMLCh local_238 [260];
  undefined4 extraout_var_00;
  
  pXVar7 = DOMNodeImpl::getXmlnsString();
  if (((this->super_DOMAttrImpl).fNode.flags & 1) != 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar6 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_05,iVar6) == 0) {
      puVar15 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar6 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar15 = (undefined8 *)(CONCAT44(extraout_var_09,iVar6) + 0x158);
    }
    DOMException::DOMException(this_00,7,0,(MemoryManager *)*puVar15);
    goto LAB_0025d6ff;
  }
  if (((this->fNamespaceURI == (XMLCh *)0x0) || (*this->fNamespaceURI == L'\0')) ||
     (pXVar10 = this->fLocalName, pXVar10 == pXVar7)) {
LAB_0025d5bc:
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar6 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_03,iVar6) == 0) {
      puVar15 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar6 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar15 = (undefined8 *)(CONCAT44(extraout_var_06,iVar6) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar15);
    goto LAB_0025d6ff;
  }
  pXVar9 = pXVar7;
  pXVar8 = pXVar10;
  if (pXVar7 == (XMLCh *)0x0 || pXVar10 == (XMLCh *)0x0) {
    if (pXVar10 == (XMLCh *)0x0) {
      if (pXVar7 == (XMLCh *)0x0) goto LAB_0025d5bc;
LAB_0025d142:
      XVar17 = *pXVar9;
    }
    else {
      XVar17 = *pXVar10;
      if (XVar17 == L'\0' && pXVar7 != (XMLCh *)0x0) goto LAB_0025d142;
    }
    if (XVar17 == L'\0') goto LAB_0025d5bc;
  }
  else {
    do {
      XVar17 = *pXVar8;
      if (XVar17 == L'\0') goto LAB_0025d142;
      XVar3 = *pXVar9;
      pXVar9 = pXVar9 + 1;
      pXVar8 = pXVar8 + 1;
    } while (XVar17 == XVar3);
  }
  if ((prefix == (XMLCh *)0x0) || (*prefix == L'\0')) {
    (this->super_DOMAttrImpl).fName = pXVar10;
    this->fPrefix = (XMLCh *)0x0;
    return;
  }
  pDVar4 = (this->super_DOMAttrImpl).fParent.fOwnerDocument;
  this_01 = (DOMDocumentImpl *)&pDVar4[-1].super_DOMNode;
  if (pDVar4 == (DOMDocument *)0x0) {
    this_01 = (DOMDocumentImpl *)0x0;
  }
  bVar5 = DOMDocumentImpl::isXMLName(this_01,prefix);
  if (!bVar5) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar6 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_07,iVar6) == 0) {
      puVar15 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar6 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar15 = (undefined8 *)(CONCAT44(extraout_var_10,iVar6) + 0x158);
    }
    DOMException::DOMException(this_00,5,0,(MemoryManager *)*puVar15);
    goto LAB_0025d6ff;
  }
  pXVar8 = DOMNodeImpl::getXmlString();
  pXVar9 = DOMNodeImpl::getXmlURIString();
  pXVar10 = DOMNodeImpl::getXmlnsURIString();
  if (pXVar8 == prefix) {
LAB_0025d1dd:
    pXVar8 = this->fNamespaceURI;
    if (pXVar8 == pXVar9) goto LAB_0025d24c;
    if (pXVar9 == (XMLCh *)0x0 || pXVar8 == (XMLCh *)0x0) {
      if (pXVar8 == (XMLCh *)0x0) {
        if (pXVar9 == (XMLCh *)0x0) goto LAB_0025d24c;
LAB_0025d240:
        XVar17 = *pXVar9;
      }
      else {
        XVar17 = *pXVar8;
        if (XVar17 == L'\0' && pXVar9 != (XMLCh *)0x0) goto LAB_0025d240;
      }
      if (XVar17 == L'\0') goto LAB_0025d24c;
    }
    else {
      do {
        XVar17 = *pXVar8;
        if (XVar17 == L'\0') goto LAB_0025d240;
        pXVar8 = pXVar8 + 1;
        XVar3 = *pXVar9;
        pXVar9 = pXVar9 + 1;
      } while (XVar17 == XVar3);
    }
LAB_0025d2e6:
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar6 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var,iVar6) == 0) {
      puVar15 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar6 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar15 = (undefined8 *)(CONCAT44(extraout_var_04,iVar6) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar15);
  }
  else {
    if (pXVar8 == (XMLCh *)0x0) {
      XVar17 = *prefix;
joined_r0x0025d1d1:
      if (XVar17 == L'\0') goto LAB_0025d1dd;
    }
    else {
      lVar14 = 0;
      do {
        psVar1 = (short *)((long)prefix + lVar14);
        if (*psVar1 == 0) {
          XVar17 = *(XMLCh *)((long)pXVar8 + lVar14);
          goto joined_r0x0025d1d1;
        }
        psVar2 = (short *)((long)pXVar8 + lVar14);
        lVar14 = lVar14 + 2;
      } while (*psVar1 == *psVar2);
    }
LAB_0025d24c:
    if (pXVar7 == prefix) {
LAB_0025d28e:
      pXVar7 = this->fNamespaceURI;
      if (pXVar7 != pXVar10) {
        if (pXVar10 != (XMLCh *)0x0 && pXVar7 != (XMLCh *)0x0) {
          do {
            XVar17 = *pXVar7;
            if (XVar17 == L'\0') goto LAB_0025d316;
            pXVar7 = pXVar7 + 1;
            XVar3 = *pXVar10;
            pXVar10 = pXVar10 + 1;
          } while (XVar17 == XVar3);
          goto LAB_0025d2e6;
        }
        if (pXVar7 == (XMLCh *)0x0) {
          if (pXVar10 == (XMLCh *)0x0) goto LAB_0025d31c;
LAB_0025d316:
          XVar17 = *pXVar10;
        }
        else {
          XVar17 = *pXVar7;
          if (XVar17 == L'\0' && pXVar10 != (XMLCh *)0x0) goto LAB_0025d316;
        }
        if (XVar17 != L'\0') goto LAB_0025d2e6;
      }
    }
    else if (pXVar7 == (XMLCh *)0x0) {
      XVar17 = *prefix;
joined_r0x0025d27a:
      if (XVar17 == L'\0') goto LAB_0025d28e;
    }
    else {
      lVar14 = 0;
      do {
        psVar1 = (short *)((long)prefix + lVar14);
        if (*psVar1 == 0) {
          XVar17 = *(XMLCh *)((long)pXVar7 + lVar14);
          goto joined_r0x0025d27a;
        }
        psVar2 = (short *)((long)pXVar7 + lVar14);
        lVar14 = lVar14 + 2;
      } while (*psVar1 == *psVar2);
    }
LAB_0025d31c:
    iVar6 = XMLString::indexOf(prefix,L':');
    if (iVar6 == -1) {
      lVar14 = 0;
      do {
        psVar1 = (short *)((long)prefix + lVar14);
        lVar14 = lVar14 + 2;
      } while (*psVar1 != 0);
      uVar11 = (ulong)(ushort)*prefix;
      if (uVar11 == 0) {
        uVar11 = 0;
      }
      else {
        XVar17 = prefix[1];
        if (XVar17 != L'\0') {
          pXVar7 = prefix + 2;
          do {
            uVar11 = (ulong)(ushort)XVar17 + (uVar11 >> 0x18) + uVar11 * 0x26;
            XVar17 = *pXVar7;
            pXVar7 = pXVar7 + 1;
          } while (XVar17 != L'\0');
        }
        uVar11 = uVar11 % this_01->fNameTableSize;
      }
      XVar18 = (lVar14 >> 1) - 1;
      pDVar12 = this_01->fNameTable[uVar11];
      if (pDVar12 == (DOMStringPoolEntry *)0x0) {
        pDVar16 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar11);
      }
      else {
        do {
          pDVar16 = pDVar12;
          if (pDVar16->fLength == XVar18) {
            pXVar7 = pDVar16->fString;
            if (pXVar7 == prefix) goto LAB_0025d41a;
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)pXVar7 + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)prefix + lVar14) == 0) goto LAB_0025d41a;
                break;
              }
              psVar2 = (short *)((long)prefix + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          pDVar12 = pDVar16->fNext;
        } while (pDVar16->fNext != (DOMStringPoolEntry *)0x0);
      }
      iVar6 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                        (this_01,XVar18 * 2 + 0x18);
      pDVar12 = (DOMStringPoolEntry *)CONCAT44(extraout_var_00,iVar6);
      pDVar16->fNext = pDVar12;
      pDVar12->fLength = XVar18;
      pDVar12->fNext = (DOMStringPoolEntry *)0x0;
      pXVar7 = pDVar12->fString;
      XMLString::copyString(pXVar7,prefix);
LAB_0025d41a:
      this->fPrefix = pXVar7;
      lVar14 = 0;
      do {
        psVar1 = (short *)((long)prefix + lVar14);
        lVar14 = lVar14 + 2;
      } while (*psVar1 != 0);
      lVar19 = 0;
      if (this->fLocalName != (XMLCh *)0x0) {
        do {
          psVar1 = (short *)((long)this->fLocalName + lVar19);
          lVar19 = lVar19 + 2;
        } while (*psVar1 != 0);
        lVar19 = (lVar19 >> 1) + -1;
      }
      uVar11 = lVar19 + (lVar14 >> 1);
      if (uVar11 < 0xff) {
        pXVar7 = local_238;
      }
      else {
        iVar6 = (*this_01->fMemoryManager->_vptr_MemoryManager[3])
                          (this_01->fMemoryManager,uVar11 * 2);
        pXVar7 = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
      }
      XMLString::copyString(pXVar7,prefix);
      (pXVar7 + (lVar14 >> 1))[-1] = L':';
      XMLString::copyString(pXVar7 + (lVar14 >> 1),this->fLocalName);
      lVar14 = 0;
      do {
        psVar1 = (short *)((long)pXVar7 + lVar14);
        lVar14 = lVar14 + 2;
      } while (*psVar1 != 0);
      uVar13 = (ulong)(ushort)*pXVar7;
      if (uVar13 == 0) {
        uVar13 = 0;
      }
      else {
        XVar17 = pXVar7[1];
        if (XVar17 != L'\0') {
          pXVar10 = pXVar7 + 2;
          do {
            uVar13 = (ulong)(ushort)XVar17 + (uVar13 >> 0x18) + uVar13 * 0x26;
            XVar17 = *pXVar10;
            pXVar10 = pXVar10 + 1;
          } while (XVar17 != L'\0');
        }
        uVar13 = uVar13 % this_01->fNameTableSize;
      }
      XVar18 = (lVar14 >> 1) - 1;
      pDVar12 = this_01->fNameTable[uVar13];
      if (pDVar12 == (DOMStringPoolEntry *)0x0) {
        pDVar16 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar13);
      }
      else {
        do {
          pDVar16 = pDVar12;
          if (pDVar16->fLength == XVar18) {
            pXVar10 = pDVar16->fString;
            if (pXVar10 == pXVar7) goto LAB_0025d588;
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)pXVar10 + lVar14);
              if (*psVar1 == 0) {
                if (*(short *)((long)pXVar7 + lVar14) == 0) goto LAB_0025d588;
                break;
              }
              psVar2 = (short *)((long)pXVar7 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 == *psVar2);
          }
          pDVar12 = pDVar16->fNext;
        } while (pDVar16->fNext != (DOMStringPoolEntry *)0x0);
      }
      iVar6 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                        (this_01,XVar18 * 2 + 0x18);
      pDVar12 = (DOMStringPoolEntry *)CONCAT44(extraout_var_02,iVar6);
      pDVar16->fNext = pDVar12;
      pDVar12->fLength = XVar18;
      pDVar12->fNext = (DOMStringPoolEntry *)0x0;
      pXVar10 = pDVar12->fString;
      XMLString::copyString(pXVar10,pXVar7);
LAB_0025d588:
      (this->super_DOMAttrImpl).fName = pXVar10;
      if (0xfe < uVar11) {
        (*this_01->fMemoryManager->_vptr_MemoryManager[4])(this_01->fMemoryManager,pXVar7);
      }
      return;
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar6 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_08,iVar6) == 0) {
      puVar15 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar6 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar15 = (undefined8 *)(CONCAT44(extraout_var_11,iVar6) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar15);
  }
LAB_0025d6ff:
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMAttrNSImpl::setPrefix(const XMLCh *prefix)
{
    const XMLCh * xmlns = DOMNodeImpl::getXmlnsString();

    if (fNode.isReadOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);
    if (fNamespaceURI == 0 || fNamespaceURI[0] == chNull || XMLString::equals(fLocalName, xmlns))
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    if (prefix == 0 || prefix[0] == chNull) {
        fName = fLocalName;
        fPrefix = 0;
        return;
    }

    DOMDocumentImpl* doc = (DOMDocumentImpl*) fParent.fOwnerDocument;

    if (!doc->isXMLName(prefix))
        throw DOMException(DOMException::INVALID_CHARACTER_ERR,0, GetDOMNodeMemoryManager);

    const XMLCh * xml = DOMNodeImpl::getXmlString();
    const XMLCh * xmlURI = DOMNodeImpl::getXmlURIString();
    const XMLCh * xmlnsURI = DOMNodeImpl::getXmlnsURIString();

    if ((XMLString::equals(prefix, xml) &&
         !XMLString::equals(fNamespaceURI, xmlURI))
        || (XMLString::equals(prefix, xmlns) &&
            !XMLString::equals(fNamespaceURI, xmlnsURI)))
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    if (XMLString::indexOf(prefix, chColon) != -1) {
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    }

    this-> fPrefix = doc->getPooledString(prefix);

    XMLSize_t prefixLen = XMLString::stringLen(prefix);
    XMLSize_t newQualifiedNameLen = prefixLen+1+XMLString::stringLen(fLocalName);
    XMLCh* newName;
    XMLCh temp[256];
    if (newQualifiedNameLen >= 255)
        newName = (XMLCh*) doc->getMemoryManager()->allocate
        (
            newQualifiedNameLen * sizeof(XMLCh)
        );//new XMLCh[newQualifiedNameLen];
    else
        newName = temp;

    // newName = prefix + chColon + fLocalName;
    XMLString::copyString(newName, prefix);
    newName[prefixLen] = chColon;
    XMLString::copyString(&newName[prefixLen+1], fLocalName);

    fName = doc->getPooledString(newName);

    if (newQualifiedNameLen >= 255)
      doc->getMemoryManager()->deallocate(newName);//delete[] newName;

}